

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

xmlEnumerationPtr xmlParseNotationType(xmlParserCtxtPtr ctxt)

{
  xmlChar xVar1;
  int iVar2;
  xmlChar *str1;
  xmlEnumerationPtr pxVar3;
  xmlEnumerationPtr pxVar4;
  xmlEnumerationPtr cur;
  xmlEnumerationPtr pxVar5;
  
  if (*ctxt->input->cur == '(') {
    pxVar4 = (xmlEnumerationPtr)0x0;
    cur = (xmlEnumerationPtr)0x0;
    do {
      xmlNextChar(ctxt);
      xmlSkipBlankCharsPE(ctxt);
      str1 = xmlParseName(ctxt);
      pxVar3 = cur;
      if (str1 == (xmlChar *)0x0) {
        xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_NAME_REQUIRED,XML_ERR_FATAL,
                   (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s",
                   "Name expected in NOTATION declaration\n");
        goto LAB_00135630;
      }
      for (; pxVar5 = cur, pxVar3 != (xmlEnumerationPtr)0x0; pxVar3 = pxVar3->next) {
        iVar2 = xmlStrEqual(str1,pxVar3->name);
        if (iVar2 != 0) {
          ctxt->valid = 0;
          xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_DTD,XML_DTD_DUP_TOKEN,XML_ERR_ERROR,str1,
                     (xmlChar *)0x0,(xmlChar *)0x0,0,
                     "standalone: attribute notation value token %s duplicated\n",str1,0);
          iVar2 = xmlDictOwns(ctxt->dict,str1);
          pxVar3 = pxVar4;
          if (iVar2 == 0) {
            (*xmlFree)(str1);
          }
          goto LAB_00135593;
        }
      }
      pxVar3 = xmlCreateEnumeration(str1);
      if (pxVar3 == (xmlEnumerationPtr)0x0) {
        xmlCtxtErrMemory(ctxt);
        goto LAB_00135630;
      }
      pxVar5 = pxVar3;
      if (pxVar4 != (xmlEnumerationPtr)0x0) {
        pxVar4->next = pxVar3;
        pxVar5 = cur;
      }
LAB_00135593:
      xmlSkipBlankCharsPE(ctxt);
      xVar1 = *ctxt->input->cur;
      pxVar4 = pxVar3;
      cur = pxVar5;
    } while (xVar1 == '|');
    if (xVar1 == ')') {
      xmlNextChar(ctxt);
    }
    else {
      xmlFatalErr(ctxt,XML_ERR_NOTATION_NOT_FINISHED,(char *)0x0);
LAB_00135630:
      xmlFreeEnumeration(cur);
      pxVar5 = (xmlEnumerationPtr)0x0;
    }
  }
  else {
    pxVar5 = (xmlEnumerationPtr)0x0;
    xmlFatalErr(ctxt,XML_ERR_NOTATION_NOT_STARTED,(char *)0x0);
  }
  return pxVar5;
}

Assistant:

xmlEnumerationPtr
xmlParseNotationType(xmlParserCtxtPtr ctxt) {
    const xmlChar *name;
    xmlEnumerationPtr ret = NULL, last = NULL, cur, tmp;

    if (RAW != '(') {
	xmlFatalErr(ctxt, XML_ERR_NOTATION_NOT_STARTED, NULL);
	return(NULL);
    }
    do {
        NEXT;
	SKIP_BLANKS_PE;
        name = xmlParseName(ctxt);
	if (name == NULL) {
	    xmlFatalErrMsg(ctxt, XML_ERR_NAME_REQUIRED,
			   "Name expected in NOTATION declaration\n");
            xmlFreeEnumeration(ret);
	    return(NULL);
	}
	tmp = ret;
	while (tmp != NULL) {
	    if (xmlStrEqual(name, tmp->name)) {
		xmlValidityError(ctxt, XML_DTD_DUP_TOKEN,
	  "standalone: attribute notation value token %s duplicated\n",
				 name, NULL);
		if (!xmlDictOwns(ctxt->dict, name))
		    xmlFree((xmlChar *) name);
		break;
	    }
	    tmp = tmp->next;
	}
	if (tmp == NULL) {
	    cur = xmlCreateEnumeration(name);
	    if (cur == NULL) {
                xmlErrMemory(ctxt);
                xmlFreeEnumeration(ret);
                return(NULL);
            }
	    if (last == NULL) ret = last = cur;
	    else {
		last->next = cur;
		last = cur;
	    }
	}
	SKIP_BLANKS_PE;
    } while (RAW == '|');
    if (RAW != ')') {
	xmlFatalErr(ctxt, XML_ERR_NOTATION_NOT_FINISHED, NULL);
        xmlFreeEnumeration(ret);
	return(NULL);
    }
    NEXT;
    return(ret);
}